

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void wiz_drop_object(object *obj)

{
  loc grid;
  player *ppVar1;
  uint8_t uVar2;
  long in_RDI;
  object *local_18;
  
  if (in_RDI != 0) {
    *(undefined1 *)(in_RDI + 0x130) = 0x13;
    uVar2 = convert_depth_to_origin((int)player->depth);
    *(uint8_t *)(in_RDI + 0x131) = uVar2;
    ppVar1 = player;
    *(int16_t *)(in_RDI + 0x132) = player->place;
    grid.x = (ppVar1->grid).x;
    grid.y = (ppVar1->grid).y;
    drop_near((chunk *)cave,&local_18,L'\0',grid,true,true);
  }
  return;
}

Assistant:

static void wiz_drop_object(struct object *obj)
{
	if (obj == NULL) return;

	/* Mark as cheat and where it was created */
	obj->origin = ORIGIN_CHEAT;
	obj->origin_depth = convert_depth_to_origin(player->depth);
	obj->origin_place = player->place;

	/* Drop the object from heaven. */
	drop_near(cave, &obj, 0, player->grid, true, true);
}